

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureCalc.h
# Opt level: O1

uint64_t __thiscall
GmmLib::GmmTextureCalc::ScaleFCRectWidth
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint64_t Width)

{
  ulong uVar1;
  sbyte sVar2;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    uVar1 = 0;
  }
  else {
    if (pTexInfo->TileMode == LEGACY_TILE_X) {
      sVar2 = 0xc;
      uVar1 = 0x2000;
    }
    else {
      if (pTexInfo->TileMode != LEGACY_TILE_Y) {
        return Width;
      }
      sVar2 = 0xb;
      uVar1 = 0x1000;
    }
    uVar1 = (ulong)((int)(uVar1 / pTexInfo->BitsPerPixel) - 1);
    uVar1 = (~uVar1 & Width + uVar1) >> sVar2;
  }
  return uVar1;
}

Assistant:

virtual uint64_t GMM_STDCALL ScaleFCRectWidth(GMM_TEXTURE_INFO * pTexInfo, uint64_t Width)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);
                uint64_t ScaledWidth = Width;

                if (pTexInfo->TileMode == LEGACY_TILE_X)
                {
                    const uint32_t FastClearRccTileXAlignWidth = 8192; // bits - RCC ( Render Color Cache ) Alignment Sizes
                    const uint32_t TileXClearWidthScale = 4096;        // bits - Clear & Resolve Rect Scaling Sizes

                    ScaledWidth = GFX_ALIGN(ScaledWidth, FastClearRccTileXAlignWidth / pTexInfo->BitsPerPixel);
                    ScaledWidth /= TileXClearWidthScale;
                }
                else if (pTexInfo->TileMode == LEGACY_TILE_Y)
                {
                    const uint32_t FastClearRccTileYAlignWidth = 4096; // bits
                    const uint32_t TileYClearWidthScale = 2048;        // bits

                    ScaledWidth = GFX_ALIGN(ScaledWidth, FastClearRccTileYAlignWidth / pTexInfo->BitsPerPixel);
                    ScaledWidth /= TileYClearWidthScale;
                }
                return ScaledWidth;
            }